

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.cpp
# Opt level: O0

bool __thiscall ObjectIdentifier::ToString(ObjectIdentifier *this,wstring *out)

{
  unsigned_long uVar1;
  bool bVar2;
  char *pcVar3;
  size_type sVar4;
  byte *pbVar5;
  const_reference pvVar6;
  wstring local_1c0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_1a0;
  wstring local_180;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_160;
  wstring local_140;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_120;
  wstring local_100;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_e0;
  undefined4 local_bc;
  unsigned_long local_b8;
  unsigned_long node;
  size_t pos;
  size_t cbRead;
  wstring tmp;
  allocator local_69;
  string local_68;
  wstring local_48;
  char *local_28;
  char *szOid;
  wstring *out_local;
  ObjectIdentifier *this_local;
  
  szOid = (char *)out;
  out_local = (wstring *)this;
  pcVar3 = GetOidString(this);
  local_28 = pcVar3;
  if (pcVar3 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_68,pcVar3,&local_69);
    utf8ToUtf16(&local_48,&local_68);
    std::__cxx11::wstring::operator=((wstring *)szOid,(wstring *)&local_48);
    std::__cxx11::wstring::~wstring((wstring *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
  }
  std::__cxx11::wstring::wstring((wstring *)&cbRead);
  pos = 0;
  node = 0;
  local_b8 = 0;
  sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->value);
  if (sVar4 == 0) {
    this_local._7_1_ = 0;
  }
  else {
    pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&this->value,0);
    if (*pbVar5 < 0x28) {
      std::__cxx11::wstring::operator=((wstring *)&cbRead,L"0");
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->value,0);
      std::__cxx11::to_wstring(&local_100,(uint)*pbVar5);
      std::operator+(&local_e0,L".",&local_100);
      std::__cxx11::wstring::operator+=((wstring *)&cbRead,(wstring *)&local_e0);
      std::__cxx11::wstring::~wstring((wstring *)&local_e0);
      std::__cxx11::wstring::~wstring((wstring *)&local_100);
      pos = 1;
    }
    else {
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->value,0);
      if (*pbVar5 < 0x50) {
        std::__cxx11::wstring::operator=((wstring *)&cbRead,L"1");
        pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (&this->value,0);
        std::__cxx11::to_wstring(&local_140,*pbVar5 - 0x28);
        std::operator+(&local_120,L".",&local_140);
        std::__cxx11::wstring::operator+=((wstring *)&cbRead,(wstring *)&local_120);
        std::__cxx11::wstring::~wstring((wstring *)&local_120);
        std::__cxx11::wstring::~wstring((wstring *)&local_140);
        pos = 1;
      }
      else {
        pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (&this->value,0);
        sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->value);
        bVar2 = DecodeLong(this,pvVar6,sVar4,&local_b8,&pos);
        if ((!bVar2) || (local_b8 < 0x50)) {
          this_local._7_1_ = 0;
          goto LAB_00158b48;
        }
        std::__cxx11::wstring::operator=((wstring *)&cbRead,L"2");
        std::__cxx11::to_wstring(&local_180,local_b8 - 0x50);
        std::operator+(&local_160,L".",&local_180);
        std::__cxx11::wstring::operator+=((wstring *)&cbRead,(wstring *)&local_160);
        std::__cxx11::wstring::~wstring((wstring *)&local_160);
        std::__cxx11::wstring::~wstring((wstring *)&local_180);
      }
    }
    for (node = pos; uVar1 = node,
        sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->value),
        uVar1 < sVar4; node = pos + node) {
      pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->value,node);
      sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->value);
      bVar2 = DecodeLong(this,pvVar6,sVar4,&local_b8,&pos);
      if (!bVar2) {
        this_local._7_1_ = 0;
        goto LAB_00158b48;
      }
      std::__cxx11::to_wstring(&local_1c0,local_b8);
      std::operator+(&local_1a0,L".",&local_1c0);
      std::__cxx11::wstring::operator+=((wstring *)&cbRead,(wstring *)&local_1a0);
      std::__cxx11::wstring::~wstring((wstring *)&local_1a0);
      std::__cxx11::wstring::~wstring((wstring *)&local_1c0);
    }
    std::__cxx11::wstring::swap((wstring *)szOid);
    this_local._7_1_ = 1;
  }
LAB_00158b48:
  local_bc = 1;
  std::__cxx11::wstring::~wstring((wstring *)&cbRead);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ObjectIdentifier::ToString(std::wstring & out) const
{
	// If possible, just look it up in our table
	const char* szOid = this->GetOidString();

	if (szOid != nullptr)
		out = utf8ToUtf16(szOid);

	std::wstring tmp;
	size_t cbRead = 0;
	size_t pos = 0;
	unsigned long node = 0;

	if (value.size() < 1)
		return false;

	if (value[0] < 40)
	{
		tmp = L"0";
		tmp += L"." + std::to_wstring(value[0]);
		cbRead = 1;
	}
	else if (value[0] < 80)
	{
		tmp = L"1";
		tmp += L"." + std::to_wstring(value[0] - 40);
		cbRead = 1;
	}
	else
	{
		if (!DecodeLong(&value[0], value.size(), node, cbRead) || node < 80)
			return false;

		tmp = L"2";
		tmp += L"." + std::to_wstring(node - 80);
	}

	pos = cbRead;

	for (; pos < value.size(); pos += cbRead)
	{
		if (!DecodeLong(&value[pos], value.size(), node, cbRead))
			return false;

		tmp += L"." + std::to_wstring(node);
	}

	out.swap(tmp);
	return true;
}